

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O2

void Jupiter::Plugin::free(void *__ptr)

{
  const_iterator __position;
  dlib *pdVar1;
  code *pcVar2;
  unique_ptr<dlib,_std::default_delete<dlib>_> dPlug;
  _Head_base<0UL,_dlib_*,_false> local_20;
  
  if (__ptr < (void *)((long)g_plugins.
                             super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)g_plugins.
                             super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::erase
              (&g_plugins,
               (const_iterator)
               (g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)__ptr));
    __position._M_current =
         g_libList.
         super__Vector_base<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + (long)__ptr;
    pdVar1 = ((__position._M_current)->_M_t).super___uniq_ptr_impl<dlib,_std::default_delete<dlib>_>
             ._M_t.super__Tuple_impl<0UL,_dlib_*,_std::default_delete<dlib>_>.
             super__Head_base<0UL,_dlib_*,_false>._M_head_impl;
    ((__position._M_current)->_M_t).super___uniq_ptr_impl<dlib,_std::default_delete<dlib>_>._M_t.
    super__Tuple_impl<0UL,_dlib_*,_std::default_delete<dlib>_>.super__Head_base<0UL,_dlib_*,_false>.
    _M_head_impl = (dlib *)0x0;
    local_20._M_head_impl = pdVar1;
    std::
    vector<std::unique_ptr<dlib,_std::default_delete<dlib>_>,_std::allocator<std::unique_ptr<dlib,_std::default_delete<dlib>_>_>_>
    ::erase(&g_libList,__position);
    pcVar2 = (code *)dlsym(pdVar1->lib,"unload");
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)();
    }
    std::unique_ptr<dlib,_std::default_delete<dlib>_>::~unique_ptr
              ((unique_ptr<dlib,_std::default_delete<dlib>_> *)&local_20);
  }
  return;
}

Assistant:

bool Jupiter::Plugin::free(size_t index) {
	if (index < g_plugins.size()) {
		// Do not free() the plugin; plugin gets free'd either by FreeLibrary() during static memory deallocation or unload.
		g_plugins.erase(g_plugins.begin() + index);
		auto dPlugItr = g_libList.begin() + index;
		std::unique_ptr<dlib> dPlug = std::move(*dPlugItr);
		g_libList.erase(dPlugItr);

		typedef void(*func_type)(void);
#if defined _WIN32
		func_type unload_func = (func_type)GetProcAddress(dPlug->lib, "unload");
#else // _WIN32
		func_type unload_func = (func_type)dlsym(dPlug->lib, "unload");
#endif // _WIN32
		if (unload_func != nullptr) {
			unload_func();
		}
		return true;
	}
	return false;
}